

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_parse_info.cpp
# Opt level: O0

unique_ptr<duckdb::AlterTableInfo,_std::default_delete<duckdb::AlterTableInfo>,_true>
duckdb::RenameColumnInfo::Deserialize(Deserializer *deserializer)

{
  pointer this;
  Deserializer *in_RSI;
  unique_ptr<duckdb::AlterTableInfo,_std::default_delete<duckdb::AlterTableInfo>_> in_RDI;
  unique_ptr<duckdb::RenameColumnInfo,_std::default_delete<duckdb::RenameColumnInfo>,_true> result;
  pointer in_stack_ffffffffffffff98;
  RenameColumnInfo *in_stack_ffffffffffffffa0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd8;
  char *in_stack_ffffffffffffffe0;
  field_id_t in_stack_ffffffffffffffee;
  Deserializer *this_00;
  
  operator_new(0xb8);
  RenameColumnInfo(in_stack_ffffffffffffffa0);
  unique_ptr<duckdb::RenameColumnInfo,std::default_delete<duckdb::RenameColumnInfo>,true>::
  unique_ptr<std::default_delete<duckdb::RenameColumnInfo>,void>
            ((unique_ptr<duckdb::RenameColumnInfo,_std::default_delete<duckdb::RenameColumnInfo>,_true>
              *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  unique_ptr<duckdb::RenameColumnInfo,_std::default_delete<duckdb::RenameColumnInfo>,_true>::
  operator->((unique_ptr<duckdb::RenameColumnInfo,_std::default_delete<duckdb::RenameColumnInfo>,_true>
              *)in_stack_ffffffffffffffa0);
  Deserializer::ReadPropertyWithDefault<std::__cxx11::string>
            (in_RSI,in_stack_ffffffffffffffee,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  this_00 = in_RSI;
  this = unique_ptr<duckdb::RenameColumnInfo,_std::default_delete<duckdb::RenameColumnInfo>,_true>::
         operator->((unique_ptr<duckdb::RenameColumnInfo,_std::default_delete<duckdb::RenameColumnInfo>,_true>
                     *)in_stack_ffffffffffffffa0);
  Deserializer::ReadPropertyWithDefault<std::__cxx11::string>
            (this_00,in_stack_ffffffffffffffee,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  unique_ptr<duckdb::AlterTableInfo,std::default_delete<duckdb::AlterTableInfo>,true>::
  unique_ptr<duckdb::RenameColumnInfo,std::default_delete<std::unique_ptr<duckdb::AlterTableInfo,std::default_delete<duckdb::AlterTableInfo>>>,void>
            ((unique_ptr<duckdb::AlterTableInfo,_std::default_delete<duckdb::AlterTableInfo>,_true>
              *)this,(unique_ptr<duckdb::RenameColumnInfo,_std::default_delete<duckdb::RenameColumnInfo>_>
                      *)in_RSI);
  unique_ptr<duckdb::RenameColumnInfo,_std::default_delete<duckdb::RenameColumnInfo>,_true>::
  ~unique_ptr((unique_ptr<duckdb::RenameColumnInfo,_std::default_delete<duckdb::RenameColumnInfo>,_true>
               *)0xae3eed);
  return (unique_ptr<duckdb::AlterTableInfo,_std::default_delete<duckdb::AlterTableInfo>_>)
         (__uniq_ptr_impl<duckdb::AlterTableInfo,_std::default_delete<duckdb::AlterTableInfo>_>)
         in_RDI._M_t.
         super___uniq_ptr_impl<duckdb::AlterTableInfo,_std::default_delete<duckdb::AlterTableInfo>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::AlterTableInfo_*,_std::default_delete<duckdb::AlterTableInfo>_>
         .super__Head_base<0UL,_duckdb::AlterTableInfo_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<AlterTableInfo> RenameColumnInfo::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<RenameColumnInfo>(new RenameColumnInfo());
	deserializer.ReadPropertyWithDefault<string>(400, "old_name", result->old_name);
	deserializer.ReadPropertyWithDefault<string>(401, "new_name", result->new_name);
	return std::move(result);
}